

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_test.cpp
# Opt level: O0

void testDefaultHelpOverride_HelpNotActive_ShouldSucceed(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  string *this;
  runtime_error *e;
  string error;
  Argengine ae;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  anon_class_1_0_00000001 *in_stack_fffffffffffffdf8;
  function<void_()> *in_stack_fffffffffffffe00;
  allocator_type *in_stack_fffffffffffffe18;
  allocator<char> *in_stack_fffffffffffffe20;
  iterator in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe38;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe40;
  iterator in_stack_fffffffffffffe48;
  string *psVar2;
  size_type in_stack_fffffffffffffe50;
  string *local_178;
  allocator<char> local_149;
  string local_148 [40];
  undefined1 local_120 [38];
  undefined1 local_fa;
  allocator<char> local_f9;
  string *local_f8;
  string local_f0 [32];
  string *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [48];
  string local_90 [35];
  undefined1 local_6d;
  allocator<char> local_59;
  string *local_58;
  string local_50 [32];
  string *local_30;
  undefined8 local_28;
  undefined1 local_20 [24];
  Argengine local_8 [8];
  
  local_6d = 1;
  local_58 = local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  local_6d = 0;
  local_30 = local_50;
  local_28 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x107d83);
  __l._M_len = (size_type)in_stack_fffffffffffffe30;
  __l._M_array = in_stack_fffffffffffffe28;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffe20,__l,in_stack_fffffffffffffe18);
  juzzlin::Argengine::Argengine(local_8,local_20,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffe00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x107ddd);
  local_178 = (string *)&local_30;
  do {
    local_178 = local_178 + -0x20;
    std::__cxx11::string::~string(local_178);
  } while (local_178 != local_50);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::string::string(local_90);
  local_fa = 1;
  local_f8 = local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  local_fa = 0;
  local_d0 = local_f0;
  local_c8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x107ed2);
  __l_00._M_len = in_stack_fffffffffffffe50;
  __l_00._M_array = in_stack_fffffffffffffe48;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffffe40,__l_00,in_stack_fffffffffffffe38,
        (allocator_type *)in_stack_fffffffffffffe30);
  std::function<void()>::function<testDefaultHelpOverride_HelpNotActive_ShouldSucceed()::__0,void>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  juzzlin::Argengine::addOption(local_8,local_c0,local_120,0,local_148);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::function<void_()>::~function((function<void_()> *)0x107f90);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x107f9d);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x107faa);
  psVar2 = local_f0;
  this = (string *)&local_d0;
  do {
    this = this + -0x20;
    std::__cxx11::string::~string(this);
  } while (this != psVar2);
  std::allocator<char>::~allocator(&local_f9);
  bVar1 = std::operator==(in_stack_fffffffffffffdf0,
                          (char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  if (!bVar1) {
    __assert_fail("error == \"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/help_test/help_test.cpp"
                  ,0x40,"void testDefaultHelpOverride_HelpNotActive_ShouldSucceed()");
  }
  std::__cxx11::string::~string(local_90);
  juzzlin::Argengine::~Argengine(local_8);
  return;
}

Assistant:

void testDefaultHelpOverride_HelpNotActive_ShouldSucceed()
{
    Argengine ae({ "test" }, false);
    std::string error;
    try {
        ae.addOption({ "-h" }, [&] {
        });
    } catch (std::runtime_error & e) {
        error = e.what();
    }
    assert(error == "");
}